

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O3

int __thiscall ON_ClippingRegion::InClipPlaneRegion(ON_ClippingRegion *this,int count,ON_3fPoint *p)

{
  uint uVar1;
  double *pdVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  iVar7 = 0;
  if (p != (ON_3fPoint *)0x0 && 0 < count) {
    if (0 < this->m_clip_plane_count) {
      uVar4 = 0;
      uVar1 = 0xffffffff;
      while( true ) {
        uVar6 = 0x40;
        uVar5 = 0;
        pdVar2 = (double *)&this->field_0x110;
        iVar7 = this->m_clip_plane_count;
        do {
          uVar3 = uVar6;
          if (-this->m_clip_plane_tolerance <=
              pdVar2[2] * (double)p->z + *pdVar2 * (double)p->x + pdVar2[1] * (double)p->y +
              pdVar2[3]) {
            uVar3 = 0;
          }
          uVar5 = uVar5 | uVar3;
          uVar6 = uVar6 * 2;
          pdVar2 = pdVar2 + 4;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        uVar4 = uVar4 | uVar5;
        uVar1 = uVar1 & uVar5;
        if (uVar1 == 0 && uVar4 != 0) break;
        p = p + 1;
        count = count + -1;
        if (count == 0) {
          iVar7 = (uVar4 == 0) + 1;
          if (uVar1 != 0) {
            iVar7 = 0;
          }
          return iVar7;
        }
      }
      return 1;
    }
    iVar7 = 2;
  }
  return iVar7;
}

Assistant:

int ON_ClippingRegion::InClipPlaneRegion( 
  int count, 
  const ON_3fPoint* p
  ) const
{
  const ON_PlaneEquation* cpeqn;
  const float* cv;
  double x;
  unsigned int out, all_out, some_out, cpbit;
  int i, j;

  // 14 May 2012 Dale Lear
  //   Fix http://dev.mcneel.com/bugtrack/?q=102481
  //   Picking hatches that are coplanar with clipping planes.
  //   The "fix" was to set clipping_plane_tolerance = same
  //   tolerance the display code uses.  Before the fix,
  //   0.0 was used as the clipping_plane_tolerance.
  const double clip_plane_tolerance = ClipPlaneTolerance();

  if ( count <= 0 || !p )
    return 0;

  if ( m_clip_plane_count <= 0 )
    return 2;

  some_out = 0;
  all_out  = 0xFFFFFFFF;
  cv = &p[0].x;
  for ( i = count; i--; cv += 3 )
  {
    out = 0;
    //if ( m_clip_plane_count )
    {
      cpbit = 0x40;
      cpeqn = m_clip_plane;
      j = m_clip_plane_count;
      while (j--)
      {
        x = cpeqn->x*cv[0] + cpeqn->y*cv[1] + cpeqn->z*cv[2] + cpeqn->d;
        if ( x < -clip_plane_tolerance )
          out |= cpbit;
        cpbit <<= 1;
        cpeqn++;
      }
    }
    some_out |= out;
    all_out  &= out;
    if ( some_out && !all_out )
    {
      //  no further "out" checking is necessary
      break;
    }
  }

  if ( all_out )
    i = 0;
  else if ( some_out )
    i = 1;
  else
    i = 2;

  return i;
}